

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# backward_references_hq.cpp
# Opt level: O2

size_t UpdateNodes(size_t num_bytes,size_t block_start,size_t pos,uint8_t *ringbuffer,
                  size_t ringbuffer_mask,BrotliEncoderParams *params,size_t max_backward_limit,
                  int *starting_dist_cache,size_t num_matches,BackwardMatch *matches,
                  ZopfliCostModel *model,StartPosQueue *queue,ZopfliNode *nodes)

{
  ulong uVar1;
  float fVar2;
  int iVar3;
  BackwardMatch BVar4;
  int iVar5;
  ushort uVar6;
  ZopfliNode *pZVar7;
  ulong uVar8;
  byte bVar9;
  uint uVar10;
  uint uVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong *puVar17;
  ulong *puVar18;
  anon_union_4_3_cc401a1e_for_u *paVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  long lVar23;
  long lVar24;
  ulong uVar25;
  size_t sVar26;
  ulong uVar27;
  long lVar28;
  ulong uVar29;
  size_t sVar30;
  long lVar31;
  ulong uVar32;
  int iVar33;
  ulong uVar34;
  ushort uVar35;
  uint uVar36;
  int iVar37;
  size_t *psVar38;
  ZopfliNode *pZVar39;
  uint uVar40;
  bool bVar41;
  float fVar42;
  float fVar43;
  float fVar44;
  
  uVar1 = pos + block_start;
  sVar26 = max_backward_limit;
  if (uVar1 < max_backward_limit) {
    sVar26 = uVar1;
  }
  uVar12 = uVar1 + params->stream_offset;
  if (max_backward_limit <= uVar12) {
    uVar12 = max_backward_limit;
  }
  uVar13 = num_bytes - pos;
  iVar3 = params->quality;
  uVar27 = 0x145;
  if (iVar3 < 0xb) {
    uVar27 = 0x96;
  }
  sVar30 = (params->dictionary).compound.total_size;
  EvaluateNode(params->stream_offset + block_start,pos,max_backward_limit,sVar30,starting_dist_cache
               ,model,queue,nodes);
  uVar8 = (ulong)((-(int)queue->idx_ & 7U) << 5);
  fVar43 = (model->literal_costs_[pos] -
           model->literal_costs_[*(long *)((long)queue->q_[0].distance_cache + (uVar8 - 8))]) +
           *(float *)((long)queue->q_[0].distance_cache + uVar8 + 0x14) + model->min_cost_cmd_;
  lVar23 = 10;
  lVar24 = 4;
  lVar31 = 3;
  for (paVar19 = &nodes[pos + 2].u; ((pos + lVar31) - 1 <= num_bytes && (paVar19->cost <= fVar43));
      paVar19 = paVar19 + 4) {
    bVar41 = lVar31 == lVar23;
    fVar42 = fVar43 + 1.0;
    if (!bVar41) {
      fVar42 = fVar43;
    }
    fVar43 = fVar42;
    lVar28 = 0;
    if (bVar41) {
      lVar28 = lVar24;
    }
    lVar24 = lVar24 << bVar41;
    lVar23 = lVar23 + lVar28;
    lVar31 = lVar31 + 1;
  }
  uVar14 = sVar30 + uVar12;
  uVar25 = 0;
  uVar8 = 0;
  do {
    if (uVar25 == (ulong)(10 < iVar3) * 4 + 1) {
      return uVar8;
    }
    uVar21 = queue->idx_;
    uVar29 = 8;
    if (uVar21 < 8) {
      uVar29 = uVar21;
    }
    if (uVar29 <= uVar25) {
      return uVar8;
    }
    uVar21 = (ulong)(((int)uVar25 - (int)uVar21 & 7U) << 5);
    uVar29 = pos - *(long *)((long)queue->q_[0].distance_cache + (uVar21 - 8));
    fVar43 = (float)uVar29;
    if (uVar29 < 6) {
      uVar32 = uVar29 & 0xffffffff;
    }
    else if (uVar29 < 0x82) {
      uVar36 = 0x1f;
      uVar10 = (uint)(uVar29 - 2);
      if (uVar10 != 0) {
        for (; uVar10 >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar32 = (ulong)((int)(uVar29 - 2 >> ((char)(uVar36 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                       (uVar36 ^ 0xffffffe0) * 2 + 0x40);
    }
    else if (uVar29 < 0x842) {
      uVar36 = 0x1f;
      if ((int)fVar43 - 0x42U != 0) {
        for (; (int)fVar43 - 0x42U >> uVar36 == 0; uVar36 = uVar36 - 1) {
        }
      }
      uVar32 = (ulong)((uVar36 ^ 0xffe0) + 0x2a);
    }
    else {
      uVar32 = 0x15;
      if (0x1841 < uVar29) {
        uVar32 = (ulong)(ushort)(0x17 - (uVar29 < 0x5842));
      }
    }
    fVar42 = (model->literal_costs_[pos] - *model->literal_costs_) +
             (float)*(uint *)(duckdb_brotli::kBrotliInsExtra + (uVar32 & 0xffff) * 4) +
             *(float *)((long)queue->q_[0].distance_cache + uVar21 + 0x10);
    uVar36 = (int)uVar32 * 8 & 0x38;
    iVar5 = (int)((uVar32 & 0xffff) >> 3) * 3;
    uVar34 = 0;
    uVar29 = lVar31 - 2;
    while (((uVar34 < 0x10 && (uVar29 < uVar13)) &&
           (uVar15 = (uVar1 & ringbuffer_mask) + uVar29, uVar15 <= ringbuffer_mask))) {
      uVar22 = (long)kDistanceCacheOffset[uVar34] +
               (long)*(int *)((long)queue->q_[0].distance_cache +
                             (ulong)kDistanceCacheIndex[uVar34] * 4 + uVar21);
      if (uVar22 <= uVar14) {
        if (sVar26 < uVar22) {
          if (uVar12 < uVar22) {
            uVar16 = (params->dictionary).compound.total_size + uVar12;
            psVar38 = (params->dictionary).compound.chunk_offsets;
            do {
              psVar38 = psVar38 + 1;
            } while (*psVar38 + uVar22 <= uVar16);
            uVar20 = *psVar38 + (uVar22 - uVar16);
            if (uVar13 <= uVar20) {
              uVar20 = uVar13;
            }
            if ((uVar29 < uVar20) &&
               (puVar17 = (ulong *)((uint8_t *)psVar38[-0x11] + (uVar16 - (psVar38[-1] + uVar22))),
               ringbuffer[uVar15] == *(uint8_t *)(uVar29 + (long)puVar17))) {
              lVar23 = 0;
              puVar18 = (ulong *)(ringbuffer + (uVar1 & ringbuffer_mask));
LAB_01f69c28:
              if (uVar20 < 8) {
                for (uVar16 = 0;
                    (uVar20 != uVar16 &&
                    (*(char *)((long)puVar17 + uVar16) == *(char *)((long)puVar18 + uVar16)));
                    uVar16 = uVar16 + 1) {
                }
              }
              else {
                if (*puVar18 == *puVar17) goto code_r0x01f69c41;
                uVar16 = *puVar17 ^ *puVar18;
                uVar15 = 0;
                if (uVar16 != 0) {
                  for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                  }
                }
                uVar16 = uVar15 >> 3 & 0x1fffffff;
              }
              uVar16 = uVar16 - lVar23;
LAB_01f69d07:
              fVar2 = model->cost_dist_[uVar34];
              do {
                iVar33 = (int)uVar29;
                lVar23 = 0;
                pZVar7 = nodes + pos + uVar29;
                do {
                  pZVar39 = pZVar7;
                  uVar15 = uVar29 + lVar23 + 1;
                  if (uVar16 < uVar15) {
                    uVar29 = uVar29 + lVar23;
                    goto LAB_01f69ed5;
                  }
                  iVar37 = (int)lVar23;
                  if (uVar15 < 10) {
                    uVar10 = (iVar33 + iVar37) - 1;
                  }
                  else if (uVar15 < 0x86) {
                    uVar11 = iVar33 + -5 + iVar37;
                    uVar10 = 0x1f;
                    if (uVar11 != 0) {
                      for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                      }
                    }
                    uVar10 = (int)((uVar29 + lVar23) - 5 >>
                                  ((char)(uVar10 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                             (uVar10 ^ 0xffffffe0) * 2 + 0x42;
                  }
                  else {
                    uVar10 = 0x17;
                    if (uVar15 < 0x846) {
                      uVar11 = iVar33 + -0x45 + iVar37;
                      uVar10 = 0x1f;
                      if (uVar11 != 0) {
                        for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
                        }
                      }
                      uVar10 = (uVar10 ^ 0xffe0) + 0x2c;
                    }
                  }
                  uVar6 = (ushort)uVar10;
                  uVar35 = uVar6 & 7 | (ushort)uVar36;
                  if (uVar6 < 0x10 && (uVar34 == 0 && (ushort)uVar32 < 8)) {
                    if (7 < uVar6) {
                      uVar35 = uVar35 + 0x40;
                    }
                  }
                  else {
                    iVar37 = ((uVar10 & 0xffff) >> 3) + iVar5;
                    uVar35 = uVar35 + ((ushort)(0x520d40 >> ((char)iVar37 * '\x02' & 0x1fU)) & 0xc0)
                                      + (short)iVar37 * 0x40 + 0x40;
                  }
                  fVar44 = fVar42;
                  if (0x7f < uVar35) {
                    fVar44 = fVar2 + fVar42;
                  }
                  fVar44 = (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra +
                                           (ulong)(uVar10 & 0xffff) * 4) + fVar44 +
                           model->cost_cmd_[uVar35];
                  lVar23 = lVar23 + 1;
                  pZVar7 = pZVar39 + 1;
                } while (pZVar39[1].u.cost <= fVar44);
                uVar29 = uVar29 + lVar23;
                pZVar39[1].length = (uint)uVar29 | 0x12000000;
                pZVar39[1].distance = (uint32_t)uVar22;
                pZVar39[1].dcode_insert_length = (uint)fVar43 | (int)uVar34 * 0x8000000 + 0x8000000U
                ;
                pZVar39[1].u.cost = fVar44;
                if (uVar8 <= uVar29) {
                  uVar8 = uVar29;
                }
              } while( true );
            }
          }
        }
        else if (uVar1 - uVar22 < uVar1) {
          uVar20 = uVar1 - uVar22 & ringbuffer_mask;
          uVar16 = uVar20 + uVar29;
          if ((uVar16 <= ringbuffer_mask) && (ringbuffer[uVar15] == ringbuffer[uVar16])) {
            puVar18 = (ulong *)(ringbuffer + uVar20);
            lVar23 = 0;
            uVar15 = uVar13;
            puVar17 = (ulong *)(ringbuffer + (uVar1 & ringbuffer_mask));
LAB_01f69c98:
            if (uVar15 < 8) {
              for (uVar16 = 0;
                  (uVar15 != uVar16 &&
                  (*(char *)((long)puVar18 + uVar16) == *(char *)((long)puVar17 + uVar16)));
                  uVar16 = uVar16 + 1) {
              }
            }
            else {
              if (*puVar17 == *puVar18) goto code_r0x01f69ca9;
              uVar16 = *puVar18 ^ *puVar17;
              uVar15 = 0;
              if (uVar16 != 0) {
                for (; (uVar16 >> uVar15 & 1) == 0; uVar15 = uVar15 + 1) {
                }
              }
              uVar16 = uVar15 >> 3 & 0x1fffffff;
            }
            uVar16 = uVar16 - lVar23;
            goto LAB_01f69d07;
          }
        }
      }
LAB_01f69ed5:
      uVar34 = uVar34 + 1;
    }
    if (uVar25 < 2) {
      uVar21 = lVar31 - 1;
      for (sVar30 = 0; sVar30 != num_matches; sVar30 = sVar30 + 1) {
        BVar4 = matches[sVar30];
        uVar34 = (ulong)BVar4 & 0xffffffff;
        uVar29 = uVar34 + 0xf;
        uVar15 = (ulong)(params->dist).num_direct_distance_codes;
        uVar32 = uVar15 + 0x10;
        if (uVar32 <= uVar29) {
          uVar10 = (params->dist).distance_postfix_bits;
          bVar9 = (byte)uVar10;
          uVar29 = ~uVar15 + uVar34 + (4L << (bVar9 & 0x3f));
          uVar11 = 0x1f;
          uVar40 = (uint)uVar29;
          if (uVar40 != 0) {
            for (; uVar40 >> uVar11 == 0; uVar11 = uVar11 - 1) {
            }
          }
          uVar15 = (ulong)((uVar11 ^ 0xffffffe0) + 0x1f);
          lVar23 = uVar15 - uVar10;
          uVar29 = (~(-1 << (bVar9 & 0x1f)) & uVar40) + uVar32 +
                   ((ulong)((uVar29 >> (uVar15 & 0x3f) & 1) != 0) + lVar23 * 2 + -2 <<
                   (bVar9 & 0x3f)) | lVar23 * 0x400;
        }
        uVar15 = (ulong)BVar4 >> 0x25;
        uVar32 = uVar15;
        if (uVar15 < uVar21) {
          uVar32 = uVar21;
        }
        if (uVar27 < uVar15) {
          uVar21 = uVar32;
        }
        fVar2 = model->cost_dist_[(uint)uVar29 & 0x3ff];
        if (uVar14 < uVar34) {
          uVar21 = uVar32;
        }
        uVar32 = (ulong)(BVar4.length_and_code & 0x1f);
        if (((ulong)BVar4 & 0x1f00000000) == 0) {
          uVar32 = uVar15;
        }
        paVar19 = &nodes[pos + uVar21].u;
        lVar23 = uVar21 * 0x2000000 + 0x12000000;
        for (; uVar21 <= uVar15; uVar21 = uVar21 + 1) {
          uVar22 = uVar21;
          if (uVar14 < uVar34) {
            uVar22 = uVar32;
          }
          iVar33 = (int)uVar22;
          if (uVar22 < 10) {
            uVar10 = iVar33 - 2;
          }
          else if (uVar22 < 0x86) {
            uVar10 = 0x1f;
            uVar11 = (uint)(uVar22 - 6);
            if (uVar11 != 0) {
              for (; uVar11 >> uVar10 == 0; uVar10 = uVar10 - 1) {
              }
            }
            uVar10 = (int)(uVar22 - 6 >> ((char)(uVar10 ^ 0xffffffe0) + 0x1fU & 0x3f)) +
                     (uVar10 ^ 0xffffffe0) * 2 + 0x42;
          }
          else {
            uVar10 = 0x17;
            if (uVar22 < 0x846) {
              uVar10 = 0x1f;
              if (iVar33 - 0x46U != 0) {
                for (; iVar33 - 0x46U >> uVar10 == 0; uVar10 = uVar10 - 1) {
                }
              }
              uVar10 = (uVar10 ^ 0xffe0) + 0x2c;
            }
          }
          iVar37 = ((uVar10 & 0xffff) >> 3) + iVar5;
          fVar44 = (float)*(uint *)(duckdb_brotli::kBrotliCopyExtra + (ulong)(uVar10 & 0xffff) * 4)
                   + (float)((uint)(uVar29 >> 10) & 0x3f) + fVar42 + fVar2 +
                   model->cost_cmd_
                   [uVar36 + ((0x520d40U >> ((char)iVar37 * '\x02' & 0x1fU) & 0xc0) + iVar37 * 0x40
                             | uVar10 & 7) + 0x40 & 0xffff];
          if (fVar44 < paVar19->cost) {
            ((ZopfliNode *)(paVar19 + -3))->length =
                 (uint)uVar21 | (int)lVar23 + iVar33 * -0x2000000;
            paVar19[-2].next = BVar4.distance;
            paVar19[-1].next = (uint32_t)fVar43;
            paVar19->cost = fVar44;
            if (uVar8 <= uVar21) {
              uVar8 = uVar21;
            }
          }
          paVar19 = paVar19 + 4;
          lVar23 = lVar23 + 0x2000000;
        }
      }
    }
    uVar25 = uVar25 + 1;
  } while( true );
code_r0x01f69ca9:
  puVar17 = puVar17 + 1;
  puVar18 = puVar18 + 1;
  uVar15 = uVar15 - 8;
  lVar23 = lVar23 + -8;
  goto LAB_01f69c98;
code_r0x01f69c41:
  puVar18 = puVar18 + 1;
  puVar17 = puVar17 + 1;
  uVar20 = uVar20 - 8;
  lVar23 = lVar23 + -8;
  goto LAB_01f69c28;
}

Assistant:

static size_t UpdateNodes(
    const size_t num_bytes, const size_t block_start, const size_t pos,
    const uint8_t* ringbuffer, const size_t ringbuffer_mask,
    const BrotliEncoderParams* params, const size_t max_backward_limit,
    const int* starting_dist_cache, const size_t num_matches,
    const BackwardMatch* matches, const ZopfliCostModel* model,
    StartPosQueue* queue, ZopfliNode* nodes) {
  const size_t stream_offset = params->stream_offset;
  const size_t cur_ix = block_start + pos;
  const size_t cur_ix_masked = cur_ix & ringbuffer_mask;
  const size_t max_distance = BROTLI_MIN(size_t, cur_ix, max_backward_limit);
  const size_t dictionary_start = BROTLI_MIN(size_t,
      cur_ix + stream_offset, max_backward_limit);
  const size_t max_len = num_bytes - pos;
  const size_t max_zopfli_len = MaxZopfliLen(params);
  const size_t max_iters = MaxZopfliCandidates(params);
  size_t min_len;
  size_t result = 0;
  size_t k;
  const CompoundDictionary* addon = &params->dictionary.compound;
  size_t gap = addon->total_size;

  EvaluateNode(block_start + stream_offset, pos, max_backward_limit, gap,
      starting_dist_cache, model, queue, nodes);

  {
    const PosData* posdata = StartPosQueueAt(queue, 0);
    float min_cost = (posdata->cost + ZopfliCostModelGetMinCostCmd(model) +
        ZopfliCostModelGetLiteralCosts(model, posdata->pos, pos));
    min_len = ComputeMinimumCopyLength(min_cost, nodes, num_bytes, pos);
  }

  /* Go over the command starting positions in order of increasing cost
     difference. */
  for (k = 0; k < max_iters && k < StartPosQueueSize(queue); ++k) {
    const PosData* posdata = StartPosQueueAt(queue, k);
    const size_t start = posdata->pos;
    const uint16_t inscode = GetInsertLengthCode(pos - start);
    const float start_costdiff = posdata->costdiff;
    const float base_cost = start_costdiff + (float)GetInsertExtra(inscode) +
        ZopfliCostModelGetLiteralCosts(model, 0, pos);

    /* Look for last distance matches using the distance cache from this
       starting position. */
    size_t best_len = min_len - 1;
    size_t j = 0;
    for (; j < BROTLI_NUM_DISTANCE_SHORT_CODES && best_len < max_len; ++j) {
      const size_t idx = kDistanceCacheIndex[j];
      const size_t backward =
          (size_t)(posdata->distance_cache[idx] + kDistanceCacheOffset[j]);
      size_t prev_ix = cur_ix - backward;
      size_t len = 0;
      uint8_t continuation = ringbuffer[cur_ix_masked + best_len];
      if (cur_ix_masked + best_len > ringbuffer_mask) {
        break;
      }
      if (BROTLI_PREDICT_FALSE(backward > dictionary_start + gap)) {
        /* Word dictionary -> ignore. */
        continue;
      }
      if (backward <= max_distance) {
        /* Regular backward reference. */
        if (prev_ix >= cur_ix) {
          continue;
        }

        prev_ix &= ringbuffer_mask;
        if (prev_ix + best_len > ringbuffer_mask ||
            continuation != ringbuffer[prev_ix + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&ringbuffer[prev_ix],
                                       &ringbuffer[cur_ix_masked],
                                       max_len);
      } else if (backward > dictionary_start) {
        size_t d = 0;
        size_t offset;
        size_t limit;
        const uint8_t* source;
        offset = dictionary_start + 1 + addon->total_size - 1;
        while (offset >= backward + addon->chunk_offsets[d + 1]) d++;
        source = addon->chunk_source[d];
        offset = offset - addon->chunk_offsets[d] - backward;
        limit = addon->chunk_offsets[d + 1] - addon->chunk_offsets[d] - offset;
        limit = limit > max_len ? max_len : limit;
        if (best_len >= limit ||
            continuation != source[offset + best_len]) {
          continue;
        }
        len = FindMatchLengthWithLimit(&source[offset],
                                       &ringbuffer[cur_ix_masked],
                                       limit);
      } else {
        /* "Gray" area. It is addressable by decoder, but this encoder
           instance does not have that data -> should not touch it. */
        continue;
      }
      {
        const float dist_cost = base_cost +
            ZopfliCostModelGetDistanceCost(model, j);
        size_t l;
        for (l = best_len + 1; l <= len; ++l) {
          const uint16_t copycode = GetCopyLengthCode(l);
          const uint16_t cmdcode =
              CombineLengthCodes(inscode, copycode, j == 0);
          const float cost = (cmdcode < 128 ? base_cost : dist_cost) +
              (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + l].u.cost) {
            UpdateZopfliNode(nodes, pos, start, l, l, backward, j + 1, cost);
            result = BROTLI_MAX(size_t, result, l);
          }
          best_len = l;
        }
      }
    }

    /* At higher iterations look only for new last distance matches, since
       looking only for new command start positions with the same distances
       does not help much. */
    if (k >= 2) continue;

    {
      /* Loop through all possible copy lengths at this position. */
      size_t len = min_len;
      for (j = 0; j < num_matches; ++j) {
        BackwardMatch match = matches[j];
        size_t dist = match.distance;
        BROTLI_BOOL is_dictionary_match =
            TO_BROTLI_BOOL(dist > dictionary_start + gap);
        /* We already tried all possible last distance matches, so we can use
           normal distance code here. */
        size_t dist_code = dist + BROTLI_NUM_DISTANCE_SHORT_CODES - 1;
        uint16_t dist_symbol;
        uint32_t distextra;
        uint32_t distnumextra;
        float dist_cost;
        size_t max_match_len;
        PrefixEncodeCopyDistance(
            dist_code, params->dist.num_direct_distance_codes,
            params->dist.distance_postfix_bits, &dist_symbol, &distextra);
        distnumextra = dist_symbol >> 10;
        dist_cost = base_cost + (float)distnumextra +
            ZopfliCostModelGetDistanceCost(model, dist_symbol & 0x3FF);

        /* Try all copy lengths up until the maximum copy length corresponding
           to this distance. If the distance refers to the static dictionary, or
           the maximum length is long enough, try only one maximum length. */
        max_match_len = BackwardMatchLength(&match);
        if (len < max_match_len &&
            (is_dictionary_match || max_match_len > max_zopfli_len)) {
          len = max_match_len;
        }
        for (; len <= max_match_len; ++len) {
          const size_t len_code =
              is_dictionary_match ? BackwardMatchLengthCode(&match) : len;
          const uint16_t copycode = GetCopyLengthCode(len_code);
          const uint16_t cmdcode = CombineLengthCodes(inscode, copycode, 0);
          const float cost = dist_cost + (float)GetCopyExtra(copycode) +
              ZopfliCostModelGetCommandCost(model, cmdcode);
          if (cost < nodes[pos + len].u.cost) {
            UpdateZopfliNode(nodes, pos, start, len, len_code, dist, 0, cost);
            result = BROTLI_MAX(size_t, result, len);
          }
        }
      }
    }
  }
  return result;
}